

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highs_c_api.cpp
# Opt level: O0

HighsInt Highs_resetHighsOptions(void *highs)

{
  HighsInt HVar1;
  string *alt_method_name;
  string *in_stack_ffffffffffffff98;
  Highs *in_stack_ffffffffffffffa0;
  undefined1 local_29 [41];
  
  alt_method_name = (string *)local_29;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(local_29 + 1),"Highs_resetHighsOptions",(allocator *)alt_method_name);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&stack0xffffffffffffffa0,"Highs_resetOptions",
             (allocator *)&stack0xffffffffffffff9f);
  Highs::deprecationMessage(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,alt_method_name);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffa0);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff9f);
  std::__cxx11::string::~string((string *)(local_29 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_29);
  HVar1 = Highs_resetOptions((void *)0x43dc55);
  return HVar1;
}

Assistant:

HighsInt Highs_resetHighsOptions(void* highs) {
  ((Highs*)highs)
      ->deprecationMessage("Highs_resetHighsOptions", "Highs_resetOptions");
  return Highs_resetOptions(highs);
}